

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.hpp
# Opt level: O2

void __thiscall helics::apps::SignalGenerator::~SignalGenerator(SignalGenerator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SignalGenerator() = default;